

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O0

Output * __thiscall
ftxui::TerminalInputParser::Parse(Output *__return_storage_ptr__,TerminalInputParser *this)

{
  bool bVar1;
  uchar uVar2;
  byte bVar3;
  TerminalInputParser *this_local;
  
  bVar1 = Eat(this);
  if (bVar1) {
    uVar2 = Current(this);
    if ((uVar2 == '\x18') || (uVar2 == '\x1a')) {
      Output::Output(__return_storage_ptr__,DROP);
    }
    else if (uVar2 == '\x1b') {
      ParseESC(__return_storage_ptr__,this);
    }
    else {
      bVar3 = Current(this);
      if (bVar3 < 0x20) {
        Output::Output(__return_storage_ptr__,SPECIAL);
      }
      else {
        uVar2 = Current(this);
        if (uVar2 == '\x7f') {
          Output::Output(__return_storage_ptr__,SPECIAL);
        }
        else {
          ParseUTF8(__return_storage_ptr__,this);
        }
      }
    }
  }
  else {
    Output::Output(__return_storage_ptr__,UNCOMPLETED);
  }
  return __return_storage_ptr__;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::Parse() {
  if (!Eat())
    return UNCOMPLETED;

  switch (Current()) {
    case 24:  // CAN
    case 26:  // SUB
      return DROP;

    case '\x1B':
      return ParseESC();
    default:
      break;
  }

  if (Current() < 32)  // C0
    return SPECIAL;

  if (Current() == 127)  // Delete
    return SPECIAL;

  return ParseUTF8();
}